

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

Severity jbcoin::Logs::toSeverity(LogSeverity level)

{
  if ((uint)level < 6) {
    return level;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/basics/impl/Log.cpp"
                ,0xf3,"static beast::severities::Severity jbcoin::Logs::toSeverity(LogSeverity)");
}

Assistant:

beast::severities::Severity
Logs::toSeverity (LogSeverity level)
{
    using namespace beast::severities;
    switch (level)
    {
    case lsTRACE:   return kTrace;
    case lsDEBUG:   return kDebug;
    case lsINFO:    return kInfo;
    case lsWARNING: return kWarning;
    case lsERROR:   return kError;
    default:
        assert(false);
    case lsFATAL:
        break;
    }

    return kFatal;
}